

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

token * parse_type(dmr_C *C,token *token,expression **tree)

{
  position pVar1;
  expression *peVar2;
  token *ptVar3;
  expression_list *local_30;
  symbol *sym;
  
  pVar1 = token->pos;
  peVar2 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
  *(undefined1 *)peVar2 = 4;
  peVar2->pos = pVar1;
  *tree = peVar2;
  peVar2->field_0x1 = 1;
  ptVar3 = dmrC_typename(C,token,(symbol **)&local_30,(int *)0x0);
  if (local_30->allocator_ != (allocator *)0x0) {
    dmrC_sparse_error(C,ptVar3->pos,"type expression should not include identifier \"%s\"",
                      (undefined1 *)((long)&local_30->allocator_->size_ + 2));
  }
  ((*tree)->field_5).expr_list = local_30;
  return ptVar3;
}

Assistant:

static struct token *parse_type(struct dmr_C *C, struct token *token, struct expression **tree)
{
	struct symbol *sym;
	*tree = dmrC_alloc_expression(C, token->pos, EXPR_TYPE);
	(*tree)->flags = Int_const_expr; /* sic */
	token = dmrC_typename(C, token, &sym, NULL);
	if (sym->ident)
		dmrC_sparse_error(C, token->pos,
			     "type expression should not include identifier "
			     "\"%s\"", sym->ident->name);
	(*tree)->symbol = sym;
	return token;
}